

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O1

uchar asc2nibble(char c)

{
  byte bVar1;
  uchar uVar2;
  
  bVar1 = c - 0x30;
  if (9 < bVar1) {
    if (5 < (byte)(c + 0xbfU)) {
      uVar2 = '\x10';
      if ((byte)(c + 0x9fU) < 6) {
        uVar2 = c + 0xa9;
      }
      return uVar2;
    }
    bVar1 = c - 0x37;
  }
  return bVar1;
}

Assistant:

unsigned char asc2nibble(char c) {

	if ((c >= '0') && (c <= '9'))
		return c - '0';

	if ((c >= 'A') && (c <= 'F'))
		return c - 'A' + 10;

	if ((c >= 'a') && (c <= 'f'))
		return c - 'a' + 10;

	return 16; /* error */
}